

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.h
# Opt level: O3

void __thiscall
ObjTypeSpecFldInfo::ObjTypeSpecFldInfo
          (ObjTypeSpecFldInfo *this,uint id,TypeId typeId,JITType *initialType,bool usesAuxSlot,
          bool isLoadedFromProto,bool usesAccessor,bool isFieldValueFixed,bool keepFieldValue,
          bool isBuiltIn,uint16 slotIndex,PropertyId propertyId,DynamicObject *protoObject,
          PropertyGuard *propertyGuard,JITTimeConstructorCache *ctorCache,
          FixedFieldInfo *fixedFieldInfoArray)

{
  Type *pTVar1;
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  TypeIDL *pTVar2;
  JITTimeConstructorCacheIDL *pJVar3;
  FixedFieldIDL *pFVar4;
  ushort uVar5;
  undefined7 in_register_00000081;
  int iVar6;
  undefined7 in_register_00000089;
  
  uVar5 = (ushort)!usesAccessor << 5;
  iVar6 = (int)CONCAT71(in_register_00000089,isLoadedFromProto);
  if (iVar6 != 0) {
    uVar5 = 0;
  }
  (this->m_data).ctorCache.ptr = (JITTimeConstructorCacheIDL *)0x0;
  (this->m_data).fixedFieldInfoArray.ptr = (FixedFieldIDL *)0x0;
  (this->m_data).typeSet.ptr = (EquivalentTypeSetIDL *)0x0;
  (this->m_data).initialType.ptr = (TypeIDL *)0x0;
  (this->m_data).protoObjectAddr.ptr = (void *)0x0;
  (this->m_data).propertyGuardValueAddr.ptr = (void *)0x0;
  (this->m_data).polymorphicInfoArray.ptr = (ObjTypeSpecPolymorphicInfoIDL *)0x0;
  (this->m_data).flags =
       (ushort)((int)CONCAT71(in_register_00000081,usesAuxSlot) << 4) |
       (ushort)(initialType != (JITType *)0x0) << 0xb | (ushort)(iVar6 << 6) |
       (ushort)usesAccessor << 7 | uVar5 |
       (ushort)isBuiltIn << 0xd | (ushort)keepFieldValue << 9 | (ushort)isFieldValueFixed << 8 |
       0x1001;
  (this->m_data).id = id;
  (this->m_data).typeId = typeId;
  pTVar1 = &(this->m_data).protoObjectAddr;
  pTVar2 = JITType::GetData(initialType);
  addr = &(this->m_data).initialType;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->m_data).initialType.ptr = pTVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->m_data).slotIndex = slotIndex;
  (this->m_data).polymorphicInfoCount = 0;
  (this->m_data).propertyId = propertyId;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->m_data).protoObjectAddr.ptr = protoObject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pTVar1 = &(this->m_data).propertyGuardValueAddr;
  Memory::Recycler::WBSetBit((char *)pTVar1);
  (this->m_data).propertyGuardValueAddr.ptr = propertyGuard;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
  pJVar3 = JITTimeConstructorCache::GetData(ctorCache);
  addr_00 = &(this->m_data).ctorCache;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (this->m_data).ctorCache.ptr = pJVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  (this->m_data).fixedFieldCount = 1;
  (this->m_data).fixedFieldInfoArraySize = 1;
  pFVar4 = FixedFieldInfo::GetRaw(fixedFieldInfoArray);
  addr_01 = &(this->m_data).fixedFieldInfoArray;
  Memory::Recycler::WBSetBit((char *)addr_01);
  (this->m_data).fixedFieldInfoArray.ptr = pFVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  (this->m_data).polymorphicInfoArray.ptr = (ObjTypeSpecPolymorphicInfoIDL *)0x0;
  return;
}

Assistant:

ObjTypeSpecFldInfo(uint id, Js::TypeId typeId, JITType* initialType,
        bool usesAuxSlot, bool isLoadedFromProto, bool usesAccessor, bool isFieldValueFixed, bool keepFieldValue, bool isBuiltIn,
        uint16 slotIndex, Js::PropertyId propertyId, Js::DynamicObject* protoObject, Js::PropertyGuard* propertyGuard,
        JITTimeConstructorCache* ctorCache, FixedFieldInfo* fixedFieldInfoArray)
    {
        ObjTypeSpecFldInfoFlags flags(InitialObjTypeSpecFldInfoFlagValue);
        flags.isPolymorphic = false;
        flags.usesAuxSlot = usesAuxSlot;
        flags.isLocal = !isLoadedFromProto && !usesAccessor;
        flags.isLoadedFromProto = isLoadedFromProto;
        flags.usesAccessor = usesAccessor;
        flags.hasFixedValue = isFieldValueFixed;
        flags.keepFieldValue = keepFieldValue;
        flags.isBeingAdded = initialType != nullptr;
        flags.doesntHaveEquivalence = true; // doesn't mean anything for data from a monomorphic cache
        flags.isBuiltIn = isBuiltIn;
        m_data.flags = flags.flags;

        m_data.id = id;
        m_data.typeId = typeId;
        m_data.typeSet = nullptr;
        m_data.initialType = initialType->GetData();
        m_data.slotIndex = slotIndex;
        m_data.polymorphicInfoCount = 0;
        m_data.propertyId = propertyId;
        m_data.protoObjectAddr = protoObject;
        m_data.propertyGuardValueAddr = (void*)propertyGuard->GetAddressOfValue();
        m_data.ctorCache = ctorCache->GetData();
        m_data.fixedFieldCount = 1;
        m_data.fixedFieldInfoArraySize = 1;
        m_data.fixedFieldInfoArray = fixedFieldInfoArray->GetRaw();
        m_data.polymorphicInfoArray = nullptr;
    }